

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int wally_tx_elements_issuance_calculate_reissuance_token
              (uchar *entropy,size_t entropy_len,uint32_t flags,uchar *bytes_out,size_t len)

{
  int iVar1;
  size_t in_R9;
  uchar buff [32];
  ulong local_28 [5];
  
  local_28[2] = 0;
  local_28[3] = 0;
  local_28[1] = 0;
  iVar1 = -2;
  if (flags < 2) {
    local_28[0] = (ulong)(byte)((char)flags + 1);
    iVar1 = tx_elements_token_from_bytes
                      (entropy,entropy_len,(uchar *)local_28,(size_t)bytes_out,(uchar *)len,in_R9);
  }
  return iVar1;
}

Assistant:

int wally_tx_elements_issuance_calculate_reissuance_token(const unsigned char *entropy,
                                                          size_t entropy_len,
                                                          uint32_t flags,
                                                          unsigned char *bytes_out,
                                                          size_t len)
{
    unsigned char buff[SHA256_LEN] = { 0 };

    if ((flags & ~WALLY_TX_FLAG_BLINDED_INITIAL_ISSUANCE))
        return WALLY_EINVAL;

    /* 32-byte '1' constant for unblinded and '2' for confidential */
    buff[0] = flags + 1;
    return tx_elements_token_from_bytes(entropy, entropy_len,
                                        buff, sizeof(buff),
                                        bytes_out, len);
}